

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O0

void __thiscall
diy::detail::KDTreePartners::KDTreePartners
          (KDTreePartners *this,int dim,int nblocks,bool wrap_,Bounds *domain_)

{
  ulong uVar1;
  size_t sVar2;
  byte in_CL;
  CoordinateVector *in_RDI;
  int j;
  int i;
  RegularDecomposer<diy::Bounds<int>_> *decomposer;
  Bounds<int> *this_00;
  Bounds<float> *in_stack_fffffffffffffda8;
  Bounds<float> *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdd8;
  BoolVector *in_stack_fffffffffffffdf8;
  BoolVector *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  int nblocks_;
  Bounds *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int dim_;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_fffffffffffffe20;
  DivisionsVector *divisions_;
  int local_14c;
  int local_148;
  DivisionsVector *local_138;
  pointer piStack_130;
  pointer local_128;
  DivisionsVector *local_118;
  undefined1 auStack_110 [40];
  DivisionsVector *local_e8;
  size_t sStack_e0;
  pointer local_d8;
  pointer local_c8;
  pointer piStack_c0;
  size_t local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8 [18];
  byte local_11;
  
  dim_ = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  nblocks_ = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_11 = in_CL & 1;
  interval((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)in_stack_fffffffffffffdd8);
  divisions_ = (DivisionsVector *)0x0;
  local_b8 = 0;
  uStack_b0._0_4_ = (type)0x0;
  uStack_b0._4_4_ = (type)0x0;
  local_c8 = (pointer)0x0;
  piStack_c0 = (pointer)0x0;
  local_a8[0]._0_4_ = (type)0x0;
  local_a8[0]._4_4_ = (type)0x0;
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x1b7802);
  sStack_e0 = 0;
  auStack_110._32_8_ = (pointer)0x0;
  local_d8 = (pointer)0x0;
  auStack_110._24_8_ = divisions_;
  local_e8 = divisions_;
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x1b783b);
  auStack_110._0_8_ = 0;
  auStack_110._8_8_ = (pointer)0x0;
  decomposer = (RegularDecomposer<diy::Bounds<int>_> *)&local_118;
  local_118 = divisions_;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x1b786c);
  piStack_130 = (pointer)0x0;
  local_128 = (pointer)0x0;
  this_00 = (Bounds<int> *)&local_138;
  local_138 = divisions_;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x1b789d);
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (in_stack_fffffffffffffe20,dim_,in_stack_fffffffffffffe10,nblocks_,
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_RDI,divisions_);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)0x1b7911);
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)0x1b791e);
  Bounds<int>::~Bounds(this_00);
  RegularAllReducePartners::RegularAllReducePartners<diy::RegularDecomposer<diy::Bounds<int>>>
            ((RegularAllReducePartners *)this_00,decomposer,0,false);
  RegularSwapPartners::RegularSwapPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            ((RegularSwapPartners *)this_00,decomposer,0,false);
  Catch::clara::std::vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>::vector
            ((vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *)0x1b7997);
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x1b79b0);
  *(byte *)&in_RDI[0x14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = local_11 & 1;
  Bounds<float>::Bounds(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_148 = 0;
  while( true ) {
    uVar1 = (ulong)local_148;
    sVar2 = RegularPartners::rounds((RegularPartners *)0x1b7a11);
    if (sVar2 <= uVar1) break;
    local_14c = 0;
    while( true ) {
      sVar2 = RegularAllReducePartners::rounds((RegularAllReducePartners *)0x1b7a57);
      if (sVar2 <= (ulong)(long)local_14c) break;
      std::make_pair<bool,int&>((bool *)decomposer,(int *)0x1b7aa1);
      Catch::clara::std::vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>::
      push_back((vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *)this_00,
                (value_type *)decomposer);
      Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,&decomposer->dim);
      sVar2 = RegularAllReducePartners::rounds((RegularAllReducePartners *)0x1b7b20);
      if ((long)local_14c == ((sVar2 >> 1) - 1) - (long)local_148) {
        local_14c = local_148 * 2 + local_14c;
      }
      local_14c = local_14c + 1;
    }
    std::make_pair<bool,int&>((bool *)decomposer,(int *)0x1b7c7b);
    Catch::clara::std::vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>::
    push_back((vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *)this_00,
              (value_type *)decomposer);
    Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,&decomposer->dim);
    std::make_pair<bool,int>((bool *)decomposer,(int *)0x1b7d14);
    Catch::clara::std::vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>::
    push_back((vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *)this_00,
              (value_type *)decomposer);
    Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,&decomposer->dim);
    local_148 = local_148 + 1;
  }
  return;
}

Assistant:

KDTreePartners(int dim, int nblocks, bool wrap_, const Bounds& domain_):
                        decomposer(1, interval(0,nblocks-1), nblocks),
                        histogram(decomposer, 2),
                        swap(decomposer, 2, false),
                        wrap(wrap_),
                        domain(domain_)
  {
    for (int i = 0; i < swap.rounds(); ++i)
    {
      // fill histogram rounds
      for (int j = 0; j < histogram.rounds(); ++j)
      {
        rounds_.push_back(std::make_pair(false, j));
        dim_.push_back(i % dim);
        if (j == histogram.rounds() / 2 - 1 - i)
            j += 2*i;
      }

      // fill swap round
      rounds_.push_back(std::make_pair(true, i));
      dim_.push_back(i % dim);

      // fill link round
      rounds_.push_back(std::make_pair(true, -1));          // (true, -1) signals link round
      dim_.push_back(i % dim);
    }
  }